

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Panel.cpp
# Opt level: O0

shared_ptr<gui::PanelStyle> __thiscall gui::Panel::getStyle(Panel *this)

{
  element_type *__fn;
  int in_ECX;
  void *__child_stack;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  element_type *in_RDI;
  void *in_R8;
  shared_ptr<gui::PanelStyle> sVar1;
  element_type *this_00;
  
  this_00 = in_RDI;
  if ((*(byte *)(in_RSI + 0x210) & 1) == 0) {
    __fn = std::__shared_ptr_access<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x288d0e);
    PanelStyle::clone((PanelStyle *)&stack0xffffffffffffffe0,(__fn *)__fn,__child_stack,in_ECX,in_R8
                     );
    std::shared_ptr<gui::PanelStyle>::operator=
              ((shared_ptr<gui::PanelStyle> *)this_00,(shared_ptr<gui::PanelStyle> *)in_RDI);
    std::shared_ptr<gui::PanelStyle>::~shared_ptr((shared_ptr<gui::PanelStyle> *)0x288d3b);
    *(undefined1 *)(in_RSI + 0x210) = 1;
  }
  std::shared_ptr<gui::PanelStyle>::shared_ptr
            ((shared_ptr<gui::PanelStyle> *)this_00,(shared_ptr<gui::PanelStyle> *)in_RDI);
  sVar1.super___shared_ptr<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  return (shared_ptr<gui::PanelStyle>)
         sVar1.super___shared_ptr<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<PanelStyle> Panel::getStyle() {
    if (!styleCopied_) {
        style_ = style_->clone();
        styleCopied_ = true;
    }
    return style_;
}